

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O1

string * __thiscall
SocketPP::RawMsg::toString_abi_cxx11_(string *__return_storage_ptr__,RawMsg *this)

{
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)local_38,(char *)this->data_,&local_39);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38,0,this->len_);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        return std::string((char*) data_, 0, len_);
    }